

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TTSnapTypes.cpp
# Opt level: O0

void TTD::NSSnapType::EmitPropertyRecordAsSnapPropertyRecord
               (PropertyRecord *pRecord,FileWriter *writer,Separator separator)

{
  bool bVar1;
  uint32 val;
  charcount_t cVar2;
  char16 *pcVar3;
  Separator separator_local;
  FileWriter *writer_local;
  PropertyRecord *pRecord_local;
  
  (*writer->_vptr_FileWriter[6])(writer,(ulong)separator);
  val = Js::PropertyRecord::GetPropertyId(pRecord);
  FileWriter::WriteUInt32(writer,propertyId,val,NoSeparator);
  bVar1 = Js::PropertyRecord::IsNumeric(pRecord);
  (*writer->_vptr_FileWriter[0xc])(writer,0x54,(ulong)bVar1,1);
  bVar1 = Js::PropertyRecord::IsBound(pRecord);
  (*writer->_vptr_FileWriter[0xc])(writer,0x53,(ulong)bVar1,1);
  bVar1 = Js::PropertyRecord::IsSymbol(pRecord);
  (*writer->_vptr_FileWriter[0xc])(writer,0x55,(ulong)bVar1,1);
  (*writer->_vptr_FileWriter[3])(writer,0x37,1);
  pcVar3 = Js::PropertyRecord::GetBuffer(pRecord);
  cVar2 = Js::PropertyRecord::GetLength(pRecord);
  (*writer->_vptr_FileWriter[0x18])(writer,pcVar3,(ulong)cVar2,0);
  (*writer->_vptr_FileWriter[7])(writer,0);
  return;
}

Assistant:

void EmitPropertyRecordAsSnapPropertyRecord(const Js::PropertyRecord* pRecord, FileWriter* writer, NSTokens::Separator separator)
        {
            writer->WriteRecordStart(separator);

            writer->WriteUInt32(NSTokens::Key::propertyId, pRecord->GetPropertyId());

            writer->WriteBool(NSTokens::Key::isNumeric, pRecord->IsNumeric(), NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::isBound, pRecord->IsBound(), NSTokens::Separator::CommaSeparator);
            writer->WriteBool(NSTokens::Key::isSymbol, pRecord->IsSymbol(), NSTokens::Separator::CommaSeparator);

            writer->WriteKey(NSTokens::Key::name, NSTokens::Separator::CommaSeparator);
            writer->WriteInlinePropertyRecordName(pRecord->GetBuffer(), pRecord->GetLength());

            writer->WriteRecordEnd();
        }